

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QTextLine currentTextLine(QTextCursor *cursor)

{
  ulong uVar1;
  long lVar2;
  QTextEngine *extraout_RDX;
  long in_FS_OFFSET;
  QTextLine QVar3;
  int relativePos;
  QTextLayout *layout;
  QTextBlock block;
  QTextLine local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  uVar1 = QTextBlock::isValid();
  if ((uVar1 & 1) == 0) {
    QTextLine::QTextLine(&local_28);
  }
  else {
    lVar2 = QTextBlock::layout();
    if (lVar2 == 0) {
      QTextLine::QTextLine(&local_28);
    }
    else {
      QTextCursor::position();
      QTextBlock::position();
      local_28.index = QTextLayout::lineForTextPosition((int)lVar2);
      local_28.eng = extraout_RDX;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar3._4_4_ = 0;
    QVar3.index = local_28.index;
    QVar3.eng = local_28.eng;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

static QTextLine currentTextLine(const QTextCursor &cursor)
{
    const QTextBlock block = cursor.block();
    if (!block.isValid())
        return QTextLine();

    const QTextLayout *layout = block.layout();
    if (!layout)
        return QTextLine();

    const int relativePos = cursor.position() - block.position();
    return layout->lineForTextPosition(relativePos);
}